

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeScale(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  string *psVar2;
  string *psVar3;
  pointer pcVar4;
  pointer pcVar5;
  long lVar6;
  void *pvVar7;
  BoxCoordinatesMode *pBVar8;
  long lVar9;
  uint __val;
  byte bVar10;
  pointer plVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  Type *pTVar15;
  Type *pTVar16;
  Type *pTVar17;
  BlobShape *pBVar18;
  LogMessage *pLVar19;
  undefined8 *puVar20;
  MultiplyLayerParams *pMVar21;
  long *plVar22;
  Type *pTVar23;
  LayerUnion LVar24;
  WeightParams *pWVar25;
  uint uVar26;
  ulong uVar27;
  RepeatedPtrField<caffe::BlobProto> *this;
  undefined8 *puVar28;
  int iVar29;
  ScaleParameter *pSVar30;
  uint __len;
  pointer plVar31;
  byte bVar32;
  byte bVar33;
  long in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str;
  vector<long,_std::allocator<long>_> biasShape;
  vector<long,_std::allocator<long>_> scaleShape;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  LogFinisher local_13a;
  byte local_139;
  undefined1 local_138 [56];
  Type *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  ulong local_d0;
  vector<long,_std::allocator<long>_> local_c8;
  int local_ac;
  vector<long,_std::allocator<long>_> local_a8;
  RepeatedPtrFieldBase *local_88;
  Type *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ScaleParameter *local_38;
  
  pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar13 = getLayerIndex(pTVar15,in_stack_00000030);
  pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_1._M_dataplus._M_p + 0x70),iVar13);
  pSVar30 = pTVar15->scale_param_;
  if (pSVar30 == (ScaleParameter *)0x0) {
    pSVar30 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
  }
  local_60 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)__str_1.field_2._8_8_;
  local_100 = pTVar15;
  if (1 < (pTVar15->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Must have 1 or 2 input(s)","");
    errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  if ((local_100->top_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    local_88 = (RepeatedPtrFieldBase *)__str_1._M_string_length;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Must have 1 output","");
    errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    local_88 = (RepeatedPtrFieldBase *)__str_1._M_string_length;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((local_100->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar19 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
    }
  }
  pTVar15 = local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_58,
              (value_type *)((local_100->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_ac = (pTVar15->bottom_).super_RepeatedPtrFieldBase.current_size_;
  bVar32 = pSVar30->bias_term_;
  bVar33 = local_ac == 1;
  if (((bool)bVar33) && ((bool)bVar32 == false)) {
    iVar13 = 1;
    iVar29 = (pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_;
joined_r0x003d86b4:
    if (iVar29 != 1) {
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"There must be 1 weight blob","");
      errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      iVar13 = (pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_;
    }
  }
  else {
    iVar13 = (pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_;
    if ((local_ac == 2) && (iVar29 = iVar13, (bool)bVar32 != false)) goto joined_r0x003d86b4;
  }
  if (((bool)bVar33 && (bool)bVar32 == true) && (iVar13 != 2)) {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"There must be 2 weight blobs","");
    errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  iVar13 = pSVar30->axis_;
  local_139 = bVar32;
  local_80 = pTVar16;
  if ((iVar13 + 4U < 8) && ((0x99U >> (iVar13 + 4U & 0x1f) & 1) != 0)) {
    local_d0 = CONCAT71(local_d0._1_7_,bVar33);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"axis","");
    uVar14 = pSVar30->axis_;
    __val = -uVar14;
    if (0 < (int)uVar14) {
      __val = uVar14;
    }
    __len = 1;
    if (9 < __val) {
      uVar27 = (ulong)__val;
      uVar12 = 4;
      do {
        __len = uVar12;
        uVar26 = (uint)uVar27;
        if (uVar26 < 100) {
          __len = __len - 2;
          goto LAB_003d8825;
        }
        if (uVar26 < 1000) {
          __len = __len - 1;
          goto LAB_003d8825;
        }
        if (uVar26 < 10000) goto LAB_003d8825;
        uVar27 = uVar27 / 10000;
        uVar12 = __len + 4;
      } while (99999 < uVar26);
      __len = __len + 1;
    }
LAB_003d8825:
    psVar2 = (local_100->name_).ptr_;
    psVar3 = (local_100->type_).ptr_;
    local_f8._0_8_ = local_f8 + 0x10;
    local_38 = pSVar30;
    std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len - (char)((int)uVar14 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_f8._0_8_ + (ulong)(uVar14 >> 0x1f)),__len,__val);
    unsupportedCaffeParrameterWithOption((string *)local_138,psVar2,psVar3,(string *)local_f8);
    pSVar30 = local_38;
    pTVar16 = local_80;
    bVar32 = local_139;
    bVar33 = (byte)local_d0;
    if ((Arena *)local_f8._0_8_ != (Arena *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    iVar13 = pSVar30->axis_;
  }
  bVar33 = bVar33 & bVar32;
  bVar10 = bVar32;
  if (iVar13 == 1) {
    if (local_ac == 1) {
LAB_003d8910:
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      puVar28 = *(undefined8 **)
                 ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar28 + 3) == 2) {
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"Scale of size 2D when axis = 1 is currently not supported",
                   "");
        errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      iVar13 = pSVar30->axis_;
      if (iVar13 != 1) goto LAB_003d89e4;
    }
  }
  else {
    if ((local_ac == 1) && (iVar13 == -3)) goto LAB_003d8910;
LAB_003d89e4:
    bVar10 = iVar13 == -3 & bVar32;
  }
  if (bVar10 != 0) {
    pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&(pTVar16->blobs_).super_RepeatedPtrFieldBase,(uint)bVar33);
    pBVar18 = pTVar17->shape_;
    if (pBVar18 == (BlobShape *)0x0) {
      pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar18->dim_).current_size_ == 2) {
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Bias of size 2D when axis = 1 is currently not supported","");
      errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
    }
  }
  iVar13 = pSVar30->axis_;
  if (iVar13 == 2) {
    if (local_ac == 1) {
LAB_003d8a95:
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      puVar28 = *(undefined8 **)
                 ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar28 + 3) == 1) {
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"Scale of size 1D when axis = 2 is currently not supported",
                   "");
        errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      iVar13 = pSVar30->axis_;
      if (iVar13 != 2) goto LAB_003d8b8a;
    }
    if (bVar32 != 0) {
LAB_003d8b95:
      pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar16->blobs_).super_RepeatedPtrFieldBase,(uint)bVar33);
      pBVar18 = pTVar17->shape_;
      if (pBVar18 == (BlobShape *)0x0) {
        pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar18->dim_).current_size_ == 1) {
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"Bias of size 1D when axis = 2 is currently not supported",""
                  );
        errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      goto LAB_003d8c0b;
    }
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_d0 = 1;
  }
  else {
    if ((local_ac == 1) && (iVar13 == -2)) goto LAB_003d8a95;
LAB_003d8b8a:
    if ((iVar13 == -2 & bVar32) != 0) goto LAB_003d8b95;
LAB_003d8c0b:
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_d0 = 1;
    if (bVar32 != 0) {
      this = &pTVar16->blobs_;
      uVar14 = (uint)bVar33;
      pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,uVar14);
      pBVar18 = pTVar17->shape_;
      if (pBVar18 == (BlobShape *)0x0) {
        pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      iVar13 = (pBVar18->dim_).current_size_;
      local_d0 = 1;
      bVar32 = local_139;
      if (iVar13 == 0) goto LAB_003d91e7;
      if (iVar13 == 1) {
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&this->super_RepeatedPtrFieldBase,uVar14);
        bVar32 = local_139;
        pBVar18 = pTVar17->shape_;
        if (pBVar18 == (BlobShape *)0x0) {
          pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        if ((pBVar18->dim_).current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar19 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar19);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        }
        local_f8._0_8_ = ((pBVar18->dim_).rep_)->elements[0];
        if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)local_f8);
        }
        else {
          *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_f8._0_8_;
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar14 = *(uint *)(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish + -1);
LAB_003d8fd3:
        local_d0 = (ulong)uVar14;
      }
      else {
        if (iVar13 == 2) {
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,(uint)bVar33);
          bVar32 = local_139;
          pBVar18 = pTVar17->shape_;
          if (pBVar18 == (BlobShape *)0x0) {
            pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          if ((pBVar18->dim_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar19 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar19);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
          }
          local_f8._0_8_ = ((pBVar18->dim_).rep_)->elements[0];
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_f8);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_f8._0_8_;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          local_d0 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,(uint)bVar33);
          pBVar18 = pTVar17->shape_;
          if (pBVar18 == (BlobShape *)0x0) {
            pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          if ((pBVar18->dim_).current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar19 = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): "
                                );
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar19);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
          }
          local_f8._0_8_ = (pBVar18->dim_).rep_[1].arena;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_f8);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_f8._0_8_;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          uVar14 = (int)local_d0 *
                   (int)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
          goto LAB_003d8fd3;
        }
        if (iVar13 - 3U < 2) {
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,uVar14);
          pBVar18 = pTVar17->shape_;
          if (pBVar18 == (BlobShape *)0x0) {
            pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar22 = google::protobuf::RepeatedField<long>::Get(&pBVar18->dim_,iVar13 - 3U);
          local_138._0_8_ = *plVar22;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_138);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_138._0_8_;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          local_d0 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,uVar14);
          pBVar18 = pTVar17->shape_;
          if (pBVar18 == (BlobShape *)0x0) {
            pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar22 = google::protobuf::RepeatedField<long>::Get(&pBVar18->dim_,iVar13 + -2);
          local_138._0_8_ = *plVar22;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_138);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_138._0_8_;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          local_d0 = local_d0 *
                     local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,(uint)bVar33);
          pBVar18 = pTVar17->shape_;
          if (pBVar18 == (BlobShape *)0x0) {
            pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          plVar22 = google::protobuf::RepeatedField<long>::Get(&pBVar18->dim_,iVar13 + -1);
          local_138._0_8_ = *plVar22;
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_138);
          }
          else {
            *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_138._0_8_;
            local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          local_d0 = (ulong)(uint)((int)local_d0 *
                                  (int)local_c8.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_finish[-1]);
          bVar32 = local_139;
          if (iVar13 == 4) {
            pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&this->super_RepeatedPtrFieldBase,(uint)bVar33);
            bVar32 = local_139;
            pBVar18 = pTVar17->shape_;
            if (pBVar18 == (BlobShape *)0x0) {
              pBVar18 = (BlobShape *)&caffe::_BlobShape_default_instance_;
            }
            if ((pBVar18->dim_).current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar19 = google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_138,
                                   "CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
            }
            if (((pBVar18->dim_).rep_)->elements[0] != 1) {
              local_138._0_8_ = local_138 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"bias","");
              psVar2 = (local_100->name_).ptr_;
              psVar3 = (local_100->type_).ptr_;
              local_f8._0_8_ = local_f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f8,"4D bias only supported when 1st dimension is 1","");
              unsupportedCaffeParrameterWithOption
                        ((string *)local_138,psVar2,psVar3,(string *)local_f8);
              goto LAB_003d8e93;
            }
          }
        }
        else {
          local_138._0_8_ = local_138 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"bias","");
          psVar2 = (local_100->name_).ptr_;
          psVar3 = (local_100->type_).ptr_;
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f8,">4D bias not supported","");
          unsupportedCaffeParrameterWithOption((string *)local_138,psVar2,psVar3,(string *)local_f8)
          ;
LAB_003d8e93:
          if ((Arena *)local_f8._0_8_ != (Arena *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
          }
          bVar32 = local_139;
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
        }
      }
LAB_003d91e7:
      pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&this->super_RepeatedPtrFieldBase,(uint)bVar33);
      if ((pTVar17->data_).current_size_ != (int)local_d0) {
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"Bias blob data inconsistent with the blob dimensions","");
        errorInCaffeProto((string *)local_138,(local_100->name_).ptr_,(local_100->type_).ptr_);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
    }
  }
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  if (local_ac != 1) {
    if (bVar32 == 0) {
      pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_88,(Type *)0x0);
      pTVar16 = local_100;
      if ((local_100->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,
                  (value_type *)((pTVar16->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if ((pTVar16->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((pTVar16->bottom_).super_RepeatedPtrFieldBase.rep_ + 1)
                 );
      psVar2 = (pTVar16->name_).ptr_;
      pcVar5 = (psVar2->_M_dataplus)._M_p;
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar5,pcVar5 + psVar2->_M_string_length);
      std::__cxx11::string::append(local_138);
      convertCaffeMetadata
                ((string *)local_138,&local_78,&local_58,
                 (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88,local_60);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (pTVar23->_oneof_case_[0] != 0xe7) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
        pTVar23->_oneof_case_[0] = 0xe7;
        pMVar21 = (MultiplyLayerParams *)operator_new(0x18);
        CoreML::Specification::MultiplyLayerParams::MultiplyLayerParams(pMVar21);
        (pTVar23->layer_).multiply_ = pMVar21;
      }
    }
    else {
      pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_88,(Type *)0x0);
      pTVar16 = local_100;
      if ((local_100->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,
                  (value_type *)((pTVar16->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if ((pTVar16->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((pTVar16->bottom_).super_RepeatedPtrFieldBase.rep_ + 1)
                 );
      local_f8._0_8_ = (Arena *)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_e8._M_allocated_capacity = 0;
      psVar2 = (pTVar16->name_).ptr_;
      pcVar5 = local_138 + 0x10;
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      local_138._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar4,pcVar4 + psVar2->_M_string_length);
      std::__cxx11::string::append(local_138);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
      if ((pointer)local_138._0_8_ != pcVar5) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      psVar2 = (pTVar16->name_).ptr_;
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      local_138._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar4,pcVar4 + psVar2->_M_string_length);
      std::__cxx11::string::append(local_138);
      convertCaffeMetadata
                ((string *)local_138,&local_78,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88
                 ,local_60);
      if ((pointer)local_138._0_8_ != pcVar5) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (pTVar23->_oneof_case_[0] != 0xe7) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
        pTVar23->_oneof_case_[0] = 0xe7;
        pMVar21 = (MultiplyLayerParams *)operator_new(0x18);
        CoreML::Specification::MultiplyLayerParams::MultiplyLayerParams(pMVar21);
        (pTVar23->layer_).multiply_ = pMVar21;
      }
      pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (local_88,(Type *)0x0);
      psVar2 = (pTVar16->name_).ptr_;
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      local_138._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar4,pcVar4 + psVar2->_M_string_length);
      std::__cxx11::string::append(local_138);
      convertCaffeMetadata
                ((string *)local_138,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8,&local_58,
                 (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88,local_60);
      if ((pointer)local_138._0_8_ != pcVar5) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (pTVar23->_oneof_case_[0] == 0xfa) {
        LVar24 = pTVar23->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
        pTVar23->_oneof_case_[0] = 0xfa;
        LVar24.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
        CoreML::Specification::BiasLayerParams::BiasLayerParams(LVar24.bias_);
        (pTVar23->layer_).bias_ = (BiasLayerParams *)LVar24;
      }
      plVar11 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        plVar31 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pvVar7 = (void *)*plVar31;
          if ((long)pvVar7 < 0) {
            __assert_fail("dim >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                          ,0xf6,
                          "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                         );
          }
          iVar13 = ((LVar24.convolution_)->kernelsize_).current_size_;
          if (iVar13 == ((LVar24.convolution_)->kernelsize_).total_size_) {
            google::protobuf::RepeatedField<unsigned_long>::Reserve
                      (&(LVar24.convolution_)->kernelsize_,iVar13 + 1);
            iVar13 = ((LVar24.convolution_)->kernelsize_).current_size_;
          }
          pWVar25 = (LVar24.innerproduct_)->bias_;
          ((LVar24.convolution_)->kernelsize_).current_size_ = iVar13 + 1;
          (&pWVar25->_internal_metadata_)[iVar13].
          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
          .ptr_ = pvVar7;
          plVar31 = plVar31 + 1;
        } while (plVar31 != plVar11);
      }
      pTVar16 = local_80;
      uVar27 = local_d0;
      pWVar25 = (LVar24.batchnorm_)->variance_;
      if (pWVar25 == (WeightParams *)0x0) {
        pWVar25 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar25);
        (LVar24.batchnorm_)->variance_ = pWVar25;
      }
      iVar13 = (int)uVar27;
      if (iVar13 < 0) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x46a);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (new_size) >= (0): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      pRVar1 = &pWVar25->floatvalue_;
      if (pRVar1->current_size_ < iVar13) {
        google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar13);
        iVar29 = pRVar1->current_size_;
        if (iVar29 != iVar13) {
          memset(((pWVar25->floatvalue_).rep_)->elements + iVar29,0,
                 (long)iVar13 * 4 + (long)iVar29 * -4);
        }
      }
      pRVar1->current_size_ = iVar13;
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      pvVar7 = ((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
      if ((RepeatedField<float> *)((long)pvVar7 + 0x18) != pRVar1) {
        pRVar1->current_size_ = 0;
        iVar13 = *(int *)((long)pvVar7 + 0x18);
        if (iVar13 != 0) {
          google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar13);
          memcpy(((pWVar25->floatvalue_).rep_)->elements + (pWVar25->floatvalue_).current_size_,
                 (void *)(*(long *)((long)pvVar7 + 0x20) + 8),
                 (long)*(int *)((long)pvVar7 + 0x18) << 2);
          (pWVar25->floatvalue_).current_size_ =
               (pWVar25->floatvalue_).current_size_ + *(int *)((long)pvVar7 + 0x18);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
    }
    goto LAB_003da26c;
  }
  if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
  }
  puVar28 = *(undefined8 **)
             ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  puVar20 = puVar28;
  if (puVar28 == (undefined8 *)0x0) {
    puVar20 = &caffe::_BlobShape_default_instance_;
  }
  iVar13 = *(int *)(puVar20 + 3);
  iVar29 = 1;
  if (iVar13 != 0) {
    if (iVar13 == 1) {
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        puVar28 = *(undefined8 **)
                   ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      }
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar28 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      local_f8._0_8_ = *(long *)(puVar28[4] + 8);
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar29 = (int)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar13 == 2) {
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        puVar28 = *(undefined8 **)
                   ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      }
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar28 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      local_f8._0_8_ = *(long *)(puVar28[4] + 8);
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar6 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      puVar28 = *(undefined8 **)
                 ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar28 + 3) < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      local_f8._0_8_ = *(long *)(puVar28[4] + 0x10);
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar29 = (int)lVar6 *
               (int)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar13 - 3U < 2) {
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        puVar28 = *(undefined8 **)
                   ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      }
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      plVar22 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar28 + 3),iVar13 - 3U);
      local_f8._0_8_ = *plVar22;
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar6 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      puVar28 = *(undefined8 **)
                 ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      plVar22 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar28 + 3),iVar13 + -2);
      local_f8._0_8_ = *plVar22;
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar9 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar19 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_13a,pLVar19);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
      }
      puVar28 = *(undefined8 **)
                 ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar28 == (undefined8 *)0x0) {
        puVar28 = &caffe::_BlobShape_default_instance_;
      }
      plVar22 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar28 + 3),iVar13 + -1);
      local_f8._0_8_ = *plVar22;
      if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_f8);
      }
      else {
        *local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f8._0_8_;
        local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar29 = (int)lVar6 * (int)lVar9 *
               (int)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
      if (iVar13 == 4) {
        if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar19 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        }
        puVar28 = *(undefined8 **)
                   ((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar28 == (undefined8 *)0x0) {
          puVar28 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar28 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar19 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
        }
        if (*(long *)(puVar28[4] + 8) != 1) {
          local_138._0_8_ = local_138 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"scale","");
          psVar2 = (local_100->name_).ptr_;
          psVar3 = (local_100->type_).ptr_;
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f8,"4D scale only supported when 1st dimension is 1","");
          unsupportedCaffeParrameterWithOption((string *)local_138,psVar2,psVar3,(string *)local_f8)
          ;
          goto LAB_003d9bf8;
        }
      }
    }
    else {
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"scale","");
      psVar2 = (local_100->name_).ptr_;
      psVar3 = (local_100->type_).ptr_;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,">4D scale not supported","");
      unsupportedCaffeParrameterWithOption((string *)local_138,psVar2,psVar3,(string *)local_f8);
LAB_003d9bf8:
      if ((Arena *)local_f8._0_8_ != (Arena *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
    }
  }
  if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
  }
  pTVar15 = local_100;
  if (*(int *)((long)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) !=
      iVar29) {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Scale blob data size inconsistent with the  blob dimensions","")
    ;
    errorInCaffeProto((string *)local_138,(pTVar15->name_).ptr_,(pTVar15->type_).ptr_);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_88,(Type *)0x0);
  if ((pTVar15->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_78,
              (value_type *)((pTVar15->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  convertCaffeMetadata
            ((pTVar15->name_).ptr_,&local_78,&local_58,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_88,local_60);
  if (pTVar23->_oneof_case_[0] == 0xf5) {
    LVar24 = pTVar23->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
    pTVar23->_oneof_case_[0] = 0xf5;
    LVar24.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    CoreML::Specification::ScaleLayerParams::ScaleLayerParams(LVar24.scale_);
    (pTVar23->layer_).scale_ = (ScaleLayerParams *)LVar24;
  }
  plVar11 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish;
  if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar31 = local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar7 = (void *)*plVar31;
      if ((long)pvVar7 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                      ,0xd4,
                      "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      iVar13 = ((LVar24.convolution_)->kernelsize_).current_size_;
      if (iVar13 == ((LVar24.convolution_)->kernelsize_).total_size_) {
        google::protobuf::RepeatedField<unsigned_long>::Reserve
                  (&(LVar24.convolution_)->kernelsize_,iVar13 + 1);
        iVar13 = ((LVar24.convolution_)->kernelsize_).current_size_;
      }
      pWVar25 = (LVar24.innerproduct_)->bias_;
      ((LVar24.convolution_)->kernelsize_).current_size_ = iVar13 + 1;
      (&pWVar25->_internal_metadata_)[iVar13].
      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
      .ptr_ = pvVar7;
      plVar31 = plVar31 + 1;
    } while (plVar31 != plVar11);
  }
  pTVar16 = local_80;
  pWVar25 = (LVar24.scale_)->scale_;
  if (pWVar25 == (WeightParams *)0x0) {
    pWVar25 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar25);
    (LVar24.scale_)->scale_ = pWVar25;
  }
  if (iVar29 < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_138,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
  }
  pRVar1 = &pWVar25->floatvalue_;
  if (pRVar1->current_size_ < iVar29) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar29);
    iVar13 = pRVar1->current_size_;
    if (iVar13 != iVar29) {
      memset(((pWVar25->floatvalue_).rep_)->elements + iVar13,0,(long)iVar29 * 4 + (long)iVar13 * -4
            );
    }
  }
  pRVar1->current_size_ = iVar29;
  if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
  }
  pvVar7 = ((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar7 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar13 = *(int *)((long)pvVar7 + 0x18);
    if (iVar13 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar13);
      memcpy(((pWVar25->floatvalue_).rep_)->elements + (pWVar25->floatvalue_).current_size_,
             (void *)(*(long *)((long)pvVar7 + 0x20) + 8),(long)*(int *)((long)pvVar7 + 0x18) << 2);
      (pWVar25->floatvalue_).current_size_ =
           (pWVar25->floatvalue_).current_size_ + *(int *)((long)pvVar7 + 0x18);
    }
  }
  plVar11 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish;
  if (local_139 != 0) {
    (LVar24.scale_)->hasbias_ = true;
    if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      plVar31 = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pvVar7 = (void *)*plVar31;
        if ((long)pvVar7 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                        ,0xdd,
                        "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        iVar13 = ((LVar24.convolution_)->stride_).current_size_;
        if (iVar13 == ((LVar24.convolution_)->stride_).total_size_) {
          google::protobuf::RepeatedField<unsigned_long>::Reserve
                    (&(LVar24.convolution_)->stride_,iVar13 + 1);
          iVar13 = ((LVar24.convolution_)->stride_).current_size_;
        }
        pBVar8 = (LVar24.cropresize_)->boxindicesmode_;
        ((LVar24.convolution_)->stride_).current_size_ = iVar13 + 1;
        (&pBVar8->_internal_metadata_)[iVar13].
        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
        .ptr_ = pvVar7;
        plVar31 = plVar31 + 1;
      } while (plVar31 != plVar11);
    }
    pTVar16 = local_80;
    uVar27 = local_d0;
    pWVar25 = (LVar24.scale_)->bias_;
    if (pWVar25 == (WeightParams *)0x0) {
      pWVar25 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar25);
      (LVar24.scale_)->bias_ = pWVar25;
    }
    iVar13 = (int)uVar27;
    if (iVar13 < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x46a);
      pLVar19 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_138,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
    }
    pRVar1 = &pWVar25->floatvalue_;
    if (pRVar1->current_size_ < iVar13) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar13);
      iVar29 = pRVar1->current_size_;
      if (iVar29 != iVar13) {
        memset(((pWVar25->floatvalue_).rep_)->elements + iVar29,0,
               (long)iVar13 * 4 + (long)iVar29 * -4);
      }
    }
    pRVar1->current_size_ = iVar13;
    if ((pTVar16->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar19 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_138,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar19);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_138);
    }
    lVar6 = *(long *)((pTVar16->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
    if ((RepeatedField<float> *)(lVar6 + 0x18) != pRVar1) {
      pRVar1->current_size_ = 0;
      iVar13 = *(int *)(lVar6 + 0x18);
      if (iVar13 != 0) {
        google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar13);
        memcpy(((pWVar25->floatvalue_).rep_)->elements + (pWVar25->floatvalue_).current_size_,
               (void *)(*(long *)(lVar6 + 0x20) + 8),(long)*(int *)(lVar6 + 0x18) << 2);
        (pWVar25->floatvalue_).current_size_ =
             (pWVar25->floatvalue_).current_size_ + *(int *)(lVar6 + 0x18);
      }
    }
  }
LAB_003da26c:
  if (local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    const caffe::ScaleParameter& caffeLayerParams =  caffeLayer.scale_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Scale layer does not support all the functionality of Caffe Scale layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Scale layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have scale as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "scale" layer
     if bottom_size == 2 => add an MLkit "multiply" layer. If bias term is true then add another CoreML "bias" layer as well.
     */
   
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    bool biasTerm = caffeLayerParams.bias_term();
    
    int biasLocation = 0;
    if (biasTerm) {
        if (nBottom == 1){
            biasLocation = 1;
        }
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if ((nBottom == 1 && !biasTerm) || (nBottom == 2 && biasTerm)){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("There must be 1 weight blob",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (nBottom == 1 && biasTerm){
        if (caffeLayerWeights.blobs_size() != 2){
            CoreMLConverter::errorInCaffeProto("There must be 2 weight blobs",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Scale of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Scale of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to the bias
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (biasTerm) {

        int dimSize = caffeLayerWeights.blobs(biasLocation).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(biasLocation).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(biasLocation).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob data inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Get params related to scale when it is a learned parameter
     */
    std::vector<int64_t> scaleShape;
    int scaleSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            scaleSize = 1;
        } else if (dimSize == 1){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 2){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            scaleSize *= scaleShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D scale only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D scale not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != scaleSize){
            CoreMLConverter::errorInCaffeProto("Scale blob data size inconsistent with the  blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::ScaleLayerParams* specLayerParams = specLayer->mutable_scale();
        for (const auto& dim: scaleShape){
            assert(dim >= 0);
            specLayerParams->add_shapescale(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* scaleWrite = specLayerParams->mutable_scale()->mutable_floatvalue();
        scaleWrite->Resize(scaleSize, 0.0);
        scaleWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
        if (biasTerm) {
            specLayerParams->set_hasbias(true);
            for (const auto& dim: biasShape){
                assert(dim >= 0);
                specLayerParams->add_shapebias(static_cast<uint64_t>(dim));
            }
            ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
            biasWrite->Resize(biasSize, 0.0);
            biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
        }
    } else if (biasTerm) {
        Specification::NeuralNetworkLayer* specLayerMul = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        std::vector<std::string> topMulLayer;
        topMulLayer.push_back(caffeLayer.name() + "_Mul_output");
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul",
                                             bottom, topMulLayer,
                                             nnWrite, mappingDataBlobNames);
        
        (void) specLayerMul->mutable_multiply();
        Specification::NeuralNetworkLayer* specLayerBias = nnWrite->Add();
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Bias",
                                             topMulLayer, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParamsBias = specLayerBias->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParamsBias->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParamsBias->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul", 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_multiply();
    }
}